

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

_Bool bson_iter_init_from_data(bson_iter_t *iter,uint8_t *data,size_t length)

{
  uint8_t uVar1;
  undefined4 uVar2;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  _Bool _Var3;
  uint8_t *puVar4;
  long *extraout_RDX;
  long *extraout_RDX_00;
  char *extraout_RDX_01;
  char *unaff_RBX;
  uint unaff_EBP;
  bson_iter_t *unaff_R14;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_from_data_cold_2();
  }
  else if (data != (uint8_t *)0x0) {
    if (((length - 0x80000000 < 0xffffffff80000005) || (*(uint *)data != length)) ||
       (data[length - 1] != '\0')) {
      (iter->value).value.v_regex.options = (char *)0x0;
      *(undefined8 *)((long)&(iter->value).value + 0x10) = 0;
      (iter->value).value_type = BSON_TYPE_EOD;
      (iter->value).padding = 0;
      (iter->value).value.v_int64 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->next_off = 0;
      iter->err_off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->raw = (uint8_t *)0x0;
      iter->len = 0;
      iter->off = 0;
      _Var3 = false;
    }
    else {
      iter->raw = data;
      iter->len = (uint32_t)length;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      _Var3 = true;
    }
    return _Var3;
  }
  bson_iter_init_from_data_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_recurse_cold_2();
  }
  else if ((bson_t *)data != (bson_t *)0x0) {
    puVar4 = iter->raw;
    uVar1 = puVar4[iter->type];
    if ((byte)(uVar1 - 3) < 2) {
      uVar2 = *(undefined4 *)(puVar4 + iter->d1);
      *(uint8_t **)data = puVar4 + iter->d1;
      *(undefined4 *)((bson_t *)data)->padding = uVar2;
      ((bson_t *)data)->padding[4] = '\0';
      ((bson_t *)data)->padding[5] = '\0';
      ((bson_t *)data)->padding[6] = '\0';
      ((bson_t *)data)->padding[7] = '\0';
      ((bson_t *)data)->padding[8] = '\0';
      ((bson_t *)data)->padding[9] = '\0';
      ((bson_t *)data)->padding[10] = '\0';
      ((bson_t *)data)->padding[0xb] = '\0';
      ((bson_t *)data)->padding[0xc] = '\0';
      ((bson_t *)data)->padding[0xd] = '\0';
      ((bson_t *)data)->padding[0xe] = '\0';
      ((bson_t *)data)->padding[0xf] = '\0';
      ((bson_t *)data)->padding[0x10] = '\0';
      ((bson_t *)data)->padding[0x11] = '\0';
      ((bson_t *)data)->padding[0x12] = '\0';
      ((bson_t *)data)->padding[0x13] = '\0';
      ((bson_t *)data)->padding[0x10] = '\0';
      ((bson_t *)data)->padding[0x11] = '\0';
      ((bson_t *)data)->padding[0x12] = '\0';
      ((bson_t *)data)->padding[0x13] = '\0';
      ((bson_t *)data)->padding[0x14] = '\0';
      ((bson_t *)data)->padding[0x15] = '\0';
      ((bson_t *)data)->padding[0x16] = '\0';
      ((bson_t *)data)->padding[0x17] = '\0';
      ((bson_t *)data)->padding[0x18] = '\0';
      ((bson_t *)data)->padding[0x19] = '\0';
      ((bson_t *)data)->padding[0x1a] = '\0';
      ((bson_t *)data)->padding[0x1b] = '\0';
      ((bson_t *)data)->padding[0x1c] = '\0';
      ((bson_t *)data)->padding[0x1d] = '\0';
      ((bson_t *)data)->padding[0x1e] = '\0';
      ((bson_t *)data)->padding[0x1f] = '\0';
      ((bson_t *)data)->padding[0x20] = '\x04';
      ((bson_t *)data)->padding[0x21] = '\0';
      ((bson_t *)data)->padding[0x22] = '\0';
      ((bson_t *)data)->padding[0x23] = '\0';
      ((bson_t *)data)->padding[0x24] = '\0';
      ((bson_t *)data)->padding[0x25] = '\0';
      ((bson_t *)data)->padding[0x26] = '\0';
      ((bson_t *)data)->padding[0x27] = '\0';
    }
    return (byte)(uVar1 - 3) < 2;
  }
  bson_iter_recurse_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_document_cold_3();
LAB_00110793:
    bson_iter_document_cold_2();
  }
  else {
    if ((bson_t *)data == (bson_t *)0x0) goto LAB_00110793;
    if (extraout_RDX != (long *)0x0) {
      *extraout_RDX = 0;
      ((bson_t *)data)->flags = 0;
      if (iter->raw[iter->type] == '\x03') {
        ((bson_t *)data)->flags = *(uint32_t *)(iter->raw + iter->d1);
        *extraout_RDX = (long)(iter->raw + iter->d1);
      }
      return (_Bool)extraout_AL;
    }
  }
  bson_iter_document_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_array_cold_3();
LAB_001107de:
    bson_iter_array_cold_2();
  }
  else {
    if ((bson_t *)data == (bson_t *)0x0) goto LAB_001107de;
    if (extraout_RDX_00 != (long *)0x0) {
      *extraout_RDX_00 = 0;
      ((bson_t *)data)->flags = 0;
      if (iter->raw[iter->type] == '\x04') {
        ((bson_t *)data)->flags = *(uint32_t *)(iter->raw + iter->d1);
        *extraout_RDX_00 = (long)(iter->raw + iter->d1);
      }
      return (_Bool)extraout_AL_00;
    }
  }
  bson_iter_array_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_find_cold_3();
LAB_00110869:
    bson_iter_init_find_cold_2();
LAB_0011086e:
    bson_iter_init_find_cold_1();
  }
  else {
    if ((bson_t *)data == (bson_t *)0x0) goto LAB_00110869;
    unaff_RBX = extraout_RDX_01;
    if (extraout_RDX_01 == (char *)0x0) goto LAB_0011086e;
    unaff_EBP = ((bson_t *)data)->len;
    unaff_R14 = iter;
    if (4 < unaff_EBP) {
      puVar4 = bson_get_data((bson_t *)data);
      iter->raw = puVar4;
      iter->len = ((bson_t *)data)->len;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      goto LAB_00110838;
    }
  }
  (unaff_R14->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_R14->value).value + 0x10) = 0;
  (unaff_R14->value).value_type = BSON_TYPE_EOD;
  (unaff_R14->value).padding = 0;
  (unaff_R14->value).value.v_int64 = 0;
  unaff_R14->d3 = 0;
  unaff_R14->d4 = 0;
  unaff_R14->next_off = 0;
  unaff_R14->err_off = 0;
  unaff_R14->type = 0;
  unaff_R14->key = 0;
  unaff_R14->d1 = 0;
  unaff_R14->d2 = 0;
  unaff_R14->raw = (uint8_t *)0x0;
  unaff_R14->len = 0;
  unaff_R14->off = 0;
LAB_00110838:
  if (4 < unaff_EBP) {
    _Var3 = _bson_iter_find_with_len(unaff_R14,unaff_RBX,-1);
    return _Var3;
  }
  return false;
}

Assistant:

bool
bson_iter_init_from_data (bson_iter_t *iter,   /* OUT */
                          const uint8_t *data, /* IN */
                          size_t length)       /* IN */
{
   uint32_t len_le;

   BSON_ASSERT (iter);
   BSON_ASSERT (data);

   if (BSON_UNLIKELY ((length < 5) || (length > INT_MAX))) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   memcpy (&len_le, data, sizeof (len_le));

   if (BSON_UNLIKELY ((size_t) BSON_UINT32_FROM_LE (len_le) != length)) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   if (BSON_UNLIKELY (data[length - 1])) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   iter->raw = (uint8_t *) data;
   iter->len = length;
   iter->off = 0;
   iter->type = 0;
   iter->key = 0;
   iter->d1 = 0;
   iter->d2 = 0;
   iter->d3 = 0;
   iter->d4 = 0;
   iter->next_off = 4;
   iter->err_off = 0;

   return true;
}